

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_point.cpp
# Opt level: O0

int metaNewIndex(lua_State *L)

{
  lua_Number lVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *pcVar4;
  Variable *pVVar5;
  char *local_108;
  char *local_c8;
  char *local_a0;
  char *value_2;
  char *value_1;
  char *value;
  allocator local_49;
  undefined1 local_48 [8];
  string k;
  Idx<Variable> var;
  Idx<Variable> *pVar;
  lua_State *L_local;
  
  puVar3 = (undefined4 *)(*lua_touserdata)(L,1);
  k.field_2._8_4_ = *puVar3;
  k.field_2._12_4_ = puVar3[1];
  pcVar4 = (*lua_tolstring)(L,2,(size_t *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,pcVar4,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,"name");
  if (bVar2) {
    local_a0 = (*lua_tolstring)(L,3,(size_t *)0x0);
    if (local_a0 == (char *)0x0) {
      local_a0 = "";
    }
    pVVar5 = Idx<Variable>::operator->((Idx<Variable> *)((long)&k.field_2 + 8));
    std::__cxx11::string::operator=((string *)&pVVar5->name,local_a0);
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"value");
    if (bVar2) {
      local_c8 = (*lua_tolstring)(L,3,(size_t *)0x0);
      if (local_c8 == (char *)0x0) {
        local_c8 = "";
      }
      pVVar5 = Idx<Variable>::operator->((Idx<Variable> *)((long)&k.field_2 + 8));
      std::__cxx11::string::operator=((string *)&pVVar5->value,local_c8);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"valueType");
      if (bVar2) {
        lVar1 = lua_tonumber(L,3);
        pVVar5 = Idx<Variable>::operator->((Idx<Variable> *)((long)&k.field_2 + 8));
        pVVar5->valueType = (int)lVar1;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"valueTypeName");
        if (bVar2) {
          local_108 = (*lua_tolstring)(L,3,(size_t *)0x0);
          if (local_108 == (char *)0x0) {
            local_108 = "";
          }
          pVVar5 = Idx<Variable>::operator->((Idx<Variable> *)((long)&k.field_2 + 8));
          std::__cxx11::string::operator=((string *)&pVVar5->valueTypeName,local_108);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return 0;
}

Assistant:

int metaNewIndex(lua_State* L)
{
	auto* pVar = (Idx<Variable>*)lua_touserdata(L, 1);
	auto var = *pVar;
	const std::string k = lua_tostring(L, 2);
	if (k == "name")
	{
		const char* value = lua_tostring(L, 3);
		var->name = value ? value : "";
	}
	else if (k == "value")
	{
		const char* value = lua_tostring(L, 3);
		var->value = value ? value : "";
	}
	else if (k == "valueType")
	{
		var->valueType = static_cast<int>(lua_tonumber(L, 3));
	}
	else if (k == "valueTypeName")
	{
		const char* value = lua_tostring(L, 3);
		var->valueTypeName = value ? value : "";
	}
	return 0;
}